

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandLine.cpp
# Opt level: O0

bool CommaSeparateAndAddOccurrence
               (Option *Handler,uint pos,StringRef ArgName,StringRef Value,bool MultiArg)

{
  uint uVar1;
  int iVar2;
  unsigned_long *puVar3;
  long lVar4;
  size_type sVar5;
  unsigned_long local_148;
  size_type Pos;
  StringRef Val;
  bool MultiArg_local;
  uint pos_local;
  Option *Handler_local;
  StringRef Value_local;
  StringRef ArgName_local;
  unsigned_long local_f8 [3];
  size_type *local_e0;
  undefined1 local_d8 [16];
  char *local_c8;
  size_type local_c0;
  undefined1 *local_b8;
  unsigned_long local_b0;
  unsigned_long local_a8;
  unsigned_long local_a0;
  size_type *local_98;
  undefined1 local_90 [16];
  unsigned_long local_80;
  long local_78;
  undefined1 *local_70;
  void *local_68;
  void *P_1;
  size_t FindBegin_1;
  char local_49;
  size_type *local_48;
  unsigned_long local_40;
  void *local_38;
  void *P;
  size_t FindBegin;
  char local_19;
  size_type *local_18;
  unsigned_long local_10;
  
  Value_local.Data = (char *)Value.Length;
  Handler_local = (Option *)Value.Data;
  Val.Length._3_1_ = MultiArg;
  Val.Length._4_4_ = pos;
  uVar1 = llvm::cl::Option::getMiscFlags(Handler);
  if ((uVar1 & 1) != 0) {
    local_18 = &Pos;
    local_19 = ',';
    FindBegin = 0;
    Pos = (size_type)Handler_local;
    Val.Data = Value_local.Data;
    puVar3 = std::min<unsigned_long>(&FindBegin,(unsigned_long *)&Val);
    P = (void *)*puVar3;
    if ((P < Val.Data) &&
       (local_38 = memchr((char *)((long)P + Pos),(int)local_19,(long)Val.Data - (long)P),
       local_38 != (void *)0x0)) {
      local_10 = (long)local_38 - Pos;
    }
    else {
      local_10 = 0xffffffffffffffff;
    }
    local_148 = local_10;
    while (uVar1 = Val.Length._4_4_, local_148 != 0xffffffffffffffff) {
      local_98 = &Pos;
      local_a0 = 0;
      local_a8 = local_148;
      puVar3 = std::min<unsigned_long>(&local_a0,(unsigned_long *)&Val);
      local_a0 = *puVar3;
      lVar4 = Pos + local_a0;
      local_b0 = (long)Val.Data - local_a0;
      puVar3 = std::min<unsigned_long>(&local_a8,&local_b0);
      local_80 = *puVar3;
      local_70 = local_90;
      local_78 = lVar4;
      uVar1 = (*Handler->_vptr_Option[10])
                        (Handler,(ulong)uVar1,ArgName.Data,ArgName.Length,lVar4,local_80,
                         (uint)(Val.Length._3_1_ & 1));
      if ((uVar1 & 1) != 0) {
        return true;
      }
      local_f8[2] = local_148 + 1;
      local_e0 = &Pos;
      local_f8[1] = 0xffffffffffffffff;
      puVar3 = std::min<unsigned_long>(local_f8 + 2,(unsigned_long *)&Val);
      local_f8[2] = *puVar3;
      sVar5 = Pos + local_f8[2];
      local_f8[0] = (long)Val.Data - local_f8[2];
      puVar3 = std::min<unsigned_long>(local_f8 + 1,local_f8);
      Val.Data = (char *)*puVar3;
      local_b8 = local_d8;
      local_48 = &Pos;
      local_49 = ',';
      FindBegin_1 = 0;
      Pos = sVar5;
      local_c8 = Val.Data;
      local_c0 = sVar5;
      puVar3 = std::min<unsigned_long>(&FindBegin_1,(unsigned_long *)&Val);
      P_1 = (void *)*puVar3;
      if ((P_1 < Val.Data) &&
         (local_68 = memchr((char *)((long)P_1 + Pos),(int)local_49,(long)Val.Data - (long)P_1),
         local_68 != (void *)0x0)) {
        local_40 = (long)local_68 - Pos;
      }
      else {
        local_40 = 0xffffffffffffffff;
      }
      local_148 = local_40;
    }
    Handler_local = (Option *)Pos;
    Value_local.Data = Val.Data;
  }
  iVar2 = (*Handler->_vptr_Option[10])
                    (Handler,(ulong)Val.Length._4_4_,ArgName.Data,ArgName.Length,Handler_local,
                     Value_local.Data,(uint)(Val.Length._3_1_ & 1));
  return (bool)((byte)iVar2 & 1);
}

Assistant:

static bool CommaSeparateAndAddOccurrence(Option *Handler, unsigned pos,
                                          StringRef ArgName, StringRef Value,
                                          bool MultiArg = false) {
  // Check to see if this option accepts a comma separated list of values.  If
  // it does, we have to split up the value into multiple values.
  if (Handler->getMiscFlags() & CommaSeparated) {
    StringRef Val(Value);
    StringRef::size_type Pos = Val.find(',');

    while (Pos != StringRef::npos) {
      // Process the portion before the comma.
      if (Handler->addOccurrence(pos, ArgName, Val.substr(0, Pos), MultiArg))
        return true;
      // Erase the portion before the comma, AND the comma.
      Val = Val.substr(Pos + 1);
      // Check for another comma.
      Pos = Val.find(',');
    }

    Value = Val;
  }

  return Handler->addOccurrence(pos, ArgName, Value, MultiArg);
}